

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  seqStore_t *seqStore;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_strategy ZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  ZSTD_matchState_t *pZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  ZSTD_blockCompressor *pp_Var12;
  BYTE *istart;
  rawSeqStore_t ldmSeqStore;
  rawSeqStore_t local_58;
  
  if (srcSize < 7) {
    if ((zc->appliedParams).cParams.strategy < ZSTD_btopt) {
      ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    }
    else {
      ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore,srcSize);
    }
    sVar9 = 1;
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthType = ZSTD_llt_none;
    pZVar4 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar4->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    uVar7 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar2 = (zc->blockState).matchState.nextToUpdate;
    if (UVar2 + 0x180 < uVar7) {
      uVar10 = (uVar7 - UVar2) - 0x180;
      if (0xbf < uVar10) {
        uVar10 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar7 - uVar10;
    }
    lVar8 = 1;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      pZVar5 = (zc->blockState).matchState.dictMatchState;
      if (pZVar5 == (ZSTD_matchState_t *)0x0) {
        lVar8 = 0;
      }
      else {
        lVar8 = 3 - (ulong)(pZVar5->dedicatedDictSearch == 0);
      }
    }
    pZVar5 = &(zc->blockState).matchState;
    seqStore = &zc->seqStore;
    pZVar6 = (zc->blockState).nextCBlock;
    lVar11 = 0;
    do {
      pZVar6->rep[lVar11] = pZVar4->rep[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      sVar9 = ZSTD_ldm_blockCompress
                        (&zc->externSeqStore,pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,
                         (zc->appliedParams).useRowMatchFinder,src,srcSize);
    }
    else if ((zc->appliedParams).ldmParams.enableLdm == 0) {
      ZVar3 = (zc->appliedParams).cParams.strategy;
      uVar7 = ZVar3 - ZSTD_greedy;
      pp_Var12 = ZSTD_selectBlockCompressor::rowBasedBlockCompressors[lVar8] + uVar7;
      if ((zc->appliedParams).useRowMatchFinder != ZSTD_urm_enableRowMatchFinder) {
        pp_Var12 = ZSTD_selectBlockCompressor::blockCompressor[lVar8] + (int)ZVar3;
      }
      if (2 < uVar7) {
        pp_Var12 = ZSTD_selectBlockCompressor::blockCompressor[lVar8] + (int)ZVar3;
      }
      (zc->blockState).matchState.ldmSeqStore = (rawSeqStore_t *)0x0;
      sVar9 = (**pp_Var12)(pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      local_58.posInSequence = 0;
      local_58.size = 0;
      local_58.pos = 0;
      local_58.seq = zc->ldmSequences;
      local_58.capacity = zc->maxNbLdmSequences;
      sVar9 = ZSTD_ldm_generateSequences
                        (&zc->ldmState,&local_58,&(zc->appliedParams).ldmParams,src,srcSize);
      if (0xffffffffffffff88 < sVar9) {
        return sVar9;
      }
      sVar9 = ZSTD_ldm_blockCompress
                        (&local_58,pZVar5,seqStore,((zc->blockState).nextCBlock)->rep,
                         (zc->appliedParams).useRowMatchFinder,src,srcSize);
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar9)),sVar9);
    ppBVar1 = &(zc->seqStore).lit;
    *ppBVar1 = *ppBVar1 + sVar9;
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        if (zc->appliedParams.cParams.strategy >= ZSTD_btopt) {
            ZSTD_ldm_skipRawSeqStoreBytes(&zc->externSeqStore, srcSize);
        } else {
            ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        }
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 curr = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (curr > ms->nextToUpdate + 384)
            ms->nextToUpdate = curr - MIN(192, (U32)(curr - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = kNullRawSeqStore;

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize), "");
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       zc->appliedParams.useRowMatchFinder,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy,
                                                                                    zc->appliedParams.useRowMatchFinder,
                                                                                    dictMode);
            ms->ldmSeqStore = NULL;
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}